

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::leftJustified
          (QString *__return_storage_ptr__,QString *this,qsizetype width,QChar fill,bool truncate)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  lVar4 = (this->d).size;
  if (lVar4 < width) {
    resize(__return_storage_ptr__,width);
    if (lVar4 != 0) {
      memcpy((__return_storage_ptr__->d).ptr,(this->d).ptr,lVar4 * 2);
    }
    pcVar1 = (__return_storage_ptr__->d).ptr;
    for (; width != lVar4; lVar4 = lVar4 + 1) {
      pcVar1[lVar4] = fill.ucs;
    }
  }
  else {
    if (!truncate) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QArrayDataPointer<char16_t>::operator=(&__return_storage_ptr__->d,&this->d);
        return __return_storage_ptr__;
      }
      goto LAB_0011da88;
    }
    left((QString *)&local_48,this,width);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pcVar1;
    local_48.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0011da88:
  __stack_chk_fail();
}

Assistant:

QString QString::leftJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        if (len)
            memcpy(result.d.data(), d.data(), sizeof(QChar)*len);
        QChar *uc = (QChar*)result.d.data() + len;
        while (padlen--)
           * uc++ = fill;
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}